

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O2

bool PartStream_BlockRead
               (TBlockStream *pStream,ULONGLONG StartOffset,ULONGLONG EndOffset,LPBYTE BlockBuffer,
               DWORD BytesNeeded,bool bAvailable)

{
  TFileStream *pStream_00;
  bool bVar1;
  bool bVar2;
  DWORD DVar3;
  void *pvVar4;
  ulong uVar5;
  undefined4 *puVar6;
  ULONGLONG ByteOffset;
  ULONGLONG local_48;
  ulong local_40;
  ULONGLONG local_38;
  
  uVar5 = (ulong)pStream->BlockSize;
  local_38 = StartOffset;
  if (pStream->FileBitmap == (void *)0x0) {
    __assert_fail("pStream->FileBitmap != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                  ,0x644,
                  "bool PartStream_BlockRead(TBlockStream *, ULONGLONG, ULONGLONG, LPBYTE, DWORD, bool)"
                 );
  }
  if ((pStream->BlockSize - 1 & (uint)StartOffset) != 0) {
    __assert_fail("(StartOffset & (pStream->BlockSize - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                  ,0x645,
                  "bool PartStream_BlockRead(TBlockStream *, ULONGLONG, ULONGLONG, LPBYTE, DWORD, bool)"
                 );
  }
  if (EndOffset <= StartOffset) {
    __assert_fail("StartOffset < EndOffset",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                  ,0x646,
                  "bool PartStream_BlockRead(TBlockStream *, ULONGLONG, ULONGLONG, LPBYTE, DWORD, bool)"
                 );
  }
  local_40 = EndOffset;
  if (bAvailable) {
    pvVar4 = (void *)((long)pStream->FileBitmap + (StartOffset / uVar5 & 0xffffffff) * 0x14);
    for (; bVar2 = local_40 <= StartOffset, StartOffset < local_40;
        StartOffset = StartOffset + uVar5) {
      DVar3 = (int)local_40 - (int)StartOffset;
      if ((uint)uVar5 < DVar3) {
        DVar3 = (uint)uVar5;
      }
      if (BytesNeeded <= DVar3) {
        DVar3 = BytesNeeded;
      }
      local_48 = *(ULONGLONG *)((long)pvVar4 + 4);
      bVar1 = (*(pStream->super_TFileStream).BaseRead)
                        (&pStream->super_TFileStream,&local_48,BlockBuffer,DVar3);
      if (!bVar1) {
        return bVar2;
      }
      uVar5 = (ulong)pStream->BlockSize;
      BlockBuffer = BlockBuffer + uVar5;
      BytesNeeded = BytesNeeded - pStream->BlockSize;
      pvVar4 = (void *)((long)pvVar4 + 0x14);
    }
  }
  else {
    pStream_00 = (pStream->super_TFileStream).pMaster;
    if (pStream_00 != (TFileStream *)0x0) {
      DVar3 = (int)EndOffset - (uint)StartOffset;
      bVar2 = FileStream_Read(pStream_00,&local_38,BlockBuffer,DVar3);
      if (bVar2) {
        bVar2 = (*(pStream->super_TFileStream).BaseGetSize)(&pStream->super_TFileStream,&local_48);
        if (!bVar2) {
          return true;
        }
        bVar2 = (*(pStream->super_TFileStream).BaseWrite)
                          (&pStream->super_TFileStream,&local_48,BlockBuffer,DVar3);
        if (!bVar2) {
          return true;
        }
        uVar5 = (ulong)pStream->BlockSize;
        if (((uint)local_38 & pStream->BlockSize - 1) != 0) {
          __assert_fail("(StartOffset & (BlockSize - 1)) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                        ,0x60d,
                        "void PartStream_UpdateBitmap(TBlockStream *, ULONGLONG, ULONGLONG, ULONGLONG)"
                       );
        }
        if (pStream->FileBitmap != (void *)0x0) {
          puVar6 = (undefined4 *)((long)pStream->FileBitmap + (local_38 / uVar5) * 0x14);
          for (; local_38 < local_40; local_38 = local_38 + uVar5) {
            *(ULONGLONG *)(puVar6 + 1) = local_48;
            *puVar6 = 3;
            local_48 = local_48 + uVar5;
            puVar6 = puVar6 + 5;
          }
          pStream->IsModified = 1;
          return true;
        }
        __assert_fail("pStream->FileBitmap != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                      ,0x60e,
                      "void PartStream_UpdateBitmap(TBlockStream *, ULONGLONG, ULONGLONG, ULONGLONG)"
                     );
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool PartStream_BlockRead(
    TBlockStream * pStream,
    ULONGLONG StartOffset,
    ULONGLONG EndOffset,
    LPBYTE BlockBuffer,
    DWORD BytesNeeded,
    bool bAvailable)
{
    PPART_FILE_MAP_ENTRY FileBitmap;
    ULONGLONG ByteOffset;
    DWORD BytesToRead;
    DWORD BlockIndex = (DWORD)(StartOffset / pStream->BlockSize);

    // The starting offset must be aligned to size of the block
    assert(pStream->FileBitmap != NULL);
    assert((StartOffset & (pStream->BlockSize - 1)) == 0);
    assert(StartOffset < EndOffset);

    // If the blocks are not available, we need to load them from the master
    // and then save to the mirror
    if(bAvailable == false)
    {
        // If we have no master, we cannot satisfy read request
        if(pStream->pMaster == NULL)
            return false;

        // Load the blocks from the master stream
        // Note that we always have to read complete blocks
        // so they get properly stored to the mirror stream
        BytesToRead = (DWORD)(EndOffset - StartOffset);
        if(!FileStream_Read(pStream->pMaster, &StartOffset, BlockBuffer, BytesToRead))
            return false;

        // The loaded blocks are going to be stored to the end of the file
        // Note that this operation is not required to succeed
        if(pStream->BaseGetSize(pStream, &ByteOffset))
        {
            // Store the loaded blocks to the mirror file.
            if(pStream->BaseWrite(pStream, &ByteOffset, BlockBuffer, BytesToRead))
            {
                PartStream_UpdateBitmap(pStream, StartOffset, EndOffset, ByteOffset);
            }
        }
    }
    else
    {
        // Get the file map entry
        FileBitmap = (PPART_FILE_MAP_ENTRY)pStream->FileBitmap + BlockIndex;

        // Read all blocks
        while(StartOffset < EndOffset)
        {
            // Get the number of bytes to be read
            BytesToRead = (DWORD)(EndOffset - StartOffset);
            if(BytesToRead > pStream->BlockSize)
                BytesToRead = pStream->BlockSize;
            if(BytesToRead > BytesNeeded)
                BytesToRead = BytesNeeded;

            // Read the block
            ByteOffset = MAKE_OFFSET64(FileBitmap->BlockOffsHi, FileBitmap->BlockOffsLo);
            if(!pStream->BaseRead(pStream, &ByteOffset, BlockBuffer, BytesToRead))
                return false;

            // Move the pointers
            StartOffset += pStream->BlockSize;
            BlockBuffer += pStream->BlockSize;
            BytesNeeded -= pStream->BlockSize;
            FileBitmap++;
        }
    }

    return true;
}